

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi.cpp
# Opt level: O0

int adl_setBank(ADL_MIDIPlayer *device,int bank)

{
  MIDIplay *this;
  OPL3 *this_00;
  Synth *synth;
  allocator local_e9;
  string local_e8;
  char local_c8 [8];
  char errBuf [150];
  MidiPlayer *play;
  int32_t bankno;
  uint32_t NumBanks;
  int bank_local;
  ADL_MIDIPlayer *device_local;
  
  play._4_4_ = bank;
  if (bank < 0) {
    play._4_4_ = 0;
  }
  unique0x00012000 = (MIDIplay *)device->adl_midiPlayer;
  if (unique0x00012000 != (MIDIplay *)0x0) {
    if (play._4_4_ < 0x4e) {
      this_00 = AdlMIDI_UPtr<OPL3,_ADLMIDI_DefaultDelete<OPL3>_>::operator*
                          (&unique0x00012000->m_synth);
      (stack0xffffffffffffffd0->m_setup).bankId = play._4_4_;
      OPL3::setEmbeddedBank(this_00,(stack0xffffffffffffffd0->m_setup).bankId);
      MIDIplay::applySetup(stack0xffffffffffffffd0);
      device_local._4_4_ = 0;
    }
    else {
      snprintf(local_c8,0x96,"Embedded bank number may only be 0..%u!\n",0x4d);
      this = stack0xffffffffffffffd0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_e8,local_c8,&local_e9);
      MIDIplay::setErrorString(this,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
      device_local._4_4_ = -1;
    }
    return device_local._4_4_;
  }
  __assert_fail("play",
                "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libADLMIDI/src/adlmidi.cpp"
                ,0xd3,"int adl_setBank(ADL_MIDIPlayer *, int)");
}

Assistant:

ADLMIDI_EXPORT int adl_setBank(ADL_MIDIPlayer *device, int bank)
{
#ifdef DISABLE_EMBEDDED_BANKS
    ADL_UNUSED(bank);
    MidiPlayer *play = GET_MIDI_PLAYER(device);
    assert(play);
    play->setErrorString("This build of libADLMIDI has no embedded banks. "
                         "Please load banks by using adl_openBankFile() or "
                         "adl_openBankData() functions instead of adl_setBank().");
    return -1;
#else
    const uint32_t NumBanks = static_cast<uint32_t>(g_embeddedBanksCount);
    int32_t bankno = bank;

    if(bankno < 0)
        bankno = 0;

    MidiPlayer *play = GET_MIDI_PLAYER(device);
    assert(play);
    if(static_cast<uint32_t>(bankno) >= NumBanks)
    {
        char errBuf[150];
        snprintf(errBuf, 150, "Embedded bank number may only be 0..%u!\n", static_cast<unsigned int>(NumBanks - 1));
        play->setErrorString(errBuf);
        return -1;
    }

    Synth &synth = *play->m_synth;
    play->m_setup.bankId = static_cast<uint32_t>(bankno);
    synth.setEmbeddedBank(play->m_setup.bankId);
    play->applySetup();

    return 0;
#endif
}